

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

iterator * __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::begin
          (iterator *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          )

{
  pointer piVar1;
  pointer piVar2;
  vector<int,_std::allocator<int>_> local_48;
  int *local_30;
  int *piStack_28;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&(this->source).source);
  local_30 = (this->source).current._M_current;
  piStack_28 = (this->source).end._M_current;
  (__return_storage_ptr__->source).super_IState<int_&>._vptr_IState =
       (_func_int **)&PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector(&(__return_storage_ptr__->source).source,&local_48)
  ;
  piVar1 = (__return_storage_ptr__->source).source.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar2 = (__return_storage_ptr__->source).source.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->source).current._M_current = piVar1;
  (__return_storage_ptr__->source).end._M_current = piVar2;
  __return_storage_ptr__->valid = piVar1 != piVar2;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator begin() { return iterator(source); }